

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::attribute(xml_node *this,char_t *name_,xml_attribute *hint_)

{
  xml_attribute_struct *attr;
  xml_node_struct *node;
  bool bVar1;
  xml_attribute_struct *i;
  xml_attribute_struct **ppxVar2;
  xml_attribute_struct *pxVar3;
  
  attr = hint_->_attr;
  node = this->_root;
  pxVar3 = attr;
  if (attr == (xml_attribute_struct *)0x0) {
    if (node == (xml_node_struct *)0x0) {
      return (xml_attribute)(xml_attribute_struct *)0x0;
    }
  }
  else if ((node == (xml_node_struct *)0x0) ||
          (bVar1 = impl::anon_unknown_0::is_attribute_of(attr,node), !bVar1)) {
    __assert_fail("!hint || (_root && impl::is_attribute_of(hint, _root))",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1619,
                  "xml_attribute pugi::xml_node::attribute(const char_t *, xml_attribute &) const");
  }
  for (; pxVar3 != (xml_attribute_struct *)0x0; pxVar3 = pxVar3->next_attribute) {
    if ((pxVar3->name != (char_t *)0x0) &&
       (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar3->name), bVar1)) goto LAB_0012aff7;
  }
  ppxVar2 = &this->_root->first_attribute;
  while( true ) {
    pxVar3 = *ppxVar2;
    if (pxVar3 == (xml_attribute_struct *)0x0) {
      return (xml_attribute)(xml_attribute_struct *)0x0;
    }
    if (pxVar3 == attr) {
      return (xml_attribute)(xml_attribute_struct *)0x0;
    }
    if ((pxVar3->name != (char_t *)0x0) &&
       (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar3->name), bVar1)) break;
    ppxVar2 = &pxVar3->next_attribute;
  }
LAB_0012aff7:
  hint_->_attr = pxVar3->next_attribute;
  return (xml_attribute)pxVar3;
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_, xml_attribute& hint_) const
	{
		xml_attribute_struct* hint = hint_._attr;

		// if hint is not an attribute of node, behavior is not defined
		assert(!hint || (_root && impl::is_attribute_of(hint, _root)));

		if (!_root) return xml_attribute();

		// optimistically search from hint up until the end
		for (xml_attribute_struct* i = hint; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = i->next_attribute;

				return xml_attribute(i);
			}
		}

		// wrap around and search from the first attribute until the hint
		// 'j' null pointer check is technically redundant, but it prevents a crash in case the assertion above fails
		for (xml_attribute_struct* j = _root->first_attribute; j && j != hint; j = j->next_attribute)
		{
			const char_t* jname = j->name;
			if (jname && impl::strequal(name_, jname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = j->next_attribute;

				return xml_attribute(j);
			}
		}

		return xml_attribute();
	}